

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

int rtosc::canonicalize_arg_vals(rtosc_arg_val_t *av,size_t n,char *port_args,MetaContainer meta)

{
  char cVar1;
  byte bVar2;
  int32_t iVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  rtosc_arg_val_t *prVar7;
  size_t sVar8;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  
  while (((byte)*port_args - 0x3a < 0x24 &&
         ((0xa00000001U >> ((ulong)((byte)*port_args - 0x3a) & 0x3f) & 1) != 0))) {
    port_args = (char *)((byte *)port_args + 1);
  }
  cVar1 = av->type;
  if (cVar1 == 'a') {
    iVar3 = rtosc_av_arr_len(av);
    lVar5 = (long)iVar3;
    sVar6 = 1;
    prVar7 = av + 1;
  }
  else {
    lVar5 = 1;
    sVar6 = n;
    prVar7 = av;
  }
  lVar9 = 0;
  do {
    if (lVar9 == lVar5) {
      if (lVar5 != 0 && cVar1 == 'a') {
        rtosc_av_arr_type_set(av,prVar7[-1].type);
      }
      return 0;
    }
    pbVar10 = (byte *)port_args;
    for (sVar8 = 0; pbVar11 = pbVar10, sVar8 != sVar6; sVar8 = sVar8 + 1) {
      do {
        do {
          pbVar10 = pbVar11 + 1;
          bVar2 = *pbVar11;
          pbVar11 = pbVar10;
        } while (bVar2 == 0x5b);
      } while (bVar2 == 0x5d);
      if ((bVar2 == 0) || (bVar2 == 0x3a)) {
        return (int)n - (int)sVar8;
      }
      if ((bVar2 == 0x69) && (prVar7->type == 'S')) {
        iVar4 = enum_key(meta,(prVar7->val).s);
        prVar7->type = 'i';
        (prVar7->val).i = iVar4;
      }
      prVar7 = prVar7 + 1;
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

int rtosc::canonicalize_arg_vals(rtosc_arg_val_t* av, size_t n,
                                 const char* port_args,
                                 Port::MetaContainer meta)
{
    const char* first0 = port_args;
    int errors_found = 0;

    // skip "[]:"
    for( ; *first0 && (*first0 == ':' || *first0 == '[' || *first0 == ']');
           ++first0) ;

    size_t arr_size;
    size_t max;
    bool is_array;
    rtosc_arg_val_t* start = av;
    if(av->type == 'a') {
        arr_size = rtosc_av_arr_len(av);
        ++av;
        max = 1; // only one element per bundle element
                 // TODO: multiple may be possible
        is_array = true;
    }
    else {
        arr_size = 1;
        max = n;
        is_array = false;
    }

    for(size_t a = 0; a < arr_size; ++a)
    {
        const char* first = first0;
        for(size_t i = 0; i < max; ++i, ++first, ++av)
        {
            // skip "[]"
            for( ; *first && (*first == '[' || *first == ']'); ++first) ;

            assert(!strchr(first0, '#'));

//            if(is_array) // TODO: currently, only one element per bundle element
//                assert(first[1] == 0);

            if(!*first || *first == ':')
            {
                // (n-i) arguments left, but we have no recipe to convert them
                return n-i;
            }

            if(av->type == 'S' && *first == 'i')
            {
                int val = enum_key(meta, av->val.s);
                if(val == std::numeric_limits<int>::min())
                    ++errors_found;
                else
                {
                    av->type = 'i';
                    av->val.i = val;
                }
            }
        }
    }
    if(is_array && arr_size)
        rtosc_av_arr_type_set(start, av[-1].type);

    return errors_found;
}